

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O1

void __thiscall
TestRegenerateCmakeTargetLinkLibraries_Public::Run
          (TestRegenerateCmakeTargetLinkLibraries_Public *this)

{
  int iVar1;
  runtime_error *this_00;
  long lVar2;
  bool bVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string expectedOutput;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  publicDeps;
  ostringstream oss;
  undefined1 *local_248;
  size_t local_240;
  undefined1 local_238 [16];
  undefined1 *local_228;
  size_t local_220;
  undefined1 local_218 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  undefined1 local_1a0 [32];
  undefined1 *local_180 [2];
  undefined1 local_170 [64];
  ios_base local_130 [264];
  
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"ComponentA","");
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"ComponentB","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_1a0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_1d0,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_208,(allocator_type *)&local_248);
  lVar2 = 0;
  do {
    if (local_170 + lVar2 != *(undefined1 **)((long)local_180 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_180 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  local_208._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_208._M_impl.super__Rb_tree_header._M_header;
  local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_208._M_impl._0_8_ = 0;
  local_208._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_208._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_208._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_248 = local_238;
  local_208._M_impl.super__Rb_tree_header._M_header._M_right =
       local_208._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,
             "target_link_libraries(${PROJECT_NAME}\n  PUBLIC\n    ComponentA\n    ComponentB\n)\n\n"
             ,"");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  RegenerateCmakeTargetLinkLibraries
            ((ostream *)local_1a0,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1d0,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_208,false);
  std::__cxx11::stringbuf::str();
  if (local_220 == local_240) {
    if (local_220 == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp(local_228,local_248,local_220);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  if (bVar3) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    if (local_248 != local_238) {
      operator_delete(local_248);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_208);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1d0);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeTargetLinkLibraries_PublicPrivate) {
  bool isHeaderOnly = false;
  const std::set<std::string> publicDeps{
    "ComponentA",
    "ComponentB"
  };
  const std::set<std::string> privateDeps{
    "ComponentZ",
    "ComponentY"
  };

  const std::string expectedOutput(
      "target_link_libraries(${PROJECT_NAME}\n"
      "  PUBLIC\n"
      "    ComponentA\n"
      "    ComponentB\n"
      "  PRIVATE\n"
      "    ComponentY\n"
      "    ComponentZ\n"
      ")\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeTargetLinkLibraries(oss, publicDeps, privateDeps, isHeaderOnly);

  ASSERT(oss.str() == expectedOutput);
}